

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_f6f6::MovieState::MovieState(MovieState *this,string *fname)

{
  duration<long,_std::ratio<1L,_1000000L>_> dVar1;
  string *in_RSI;
  unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter> *in_RDI;
  MovieState *in_stack_00000018;
  AudioState *in_stack_00000020;
  unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter> *this_00;
  MovieState *movie;
  VideoState *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  std::unique_ptr<AVIOContext,(anonymous_namespace)::AVIOContextDeleter>::
  unique_ptr<(anonymous_namespace)::AVIOContextDeleter,void>
            ((unique_ptr<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter> *)in_RDI);
  std::unique_ptr<AVFormatContext,(anonymous_namespace)::AVFormatCtxDeleter>::
  unique_ptr<(anonymous_namespace)::AVFormatCtxDeleter,void>(this_00);
  *(undefined4 *)
   &in_RDI[2]._M_t.super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>
    ._M_t.super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>.
    super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl = 2;
  dVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::min();
  in_RDI[3]._M_t.super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>.
  _M_t.super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>.
  super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl = (AVFormatContext *)dVar1.__r;
  std::atomic<bool>::atomic((atomic<bool> *)this_00,SUB81((ulong)in_RSI >> 0x38,0));
  movie = (MovieState *)(in_RDI + 5);
  AudioState::AudioState(in_stack_00000020,in_stack_00000018);
  VideoState::VideoState(in_stack_ffffffffffffffe0,movie);
  std::thread::thread((thread *)0x10dee0);
  std::thread::thread((thread *)0x10def1);
  std::thread::thread((thread *)0x10df02);
  std::__cxx11::string::string((string *)(this_00 + 0xb4),in_RSI);
  return;
}

Assistant:

MovieState(std::string fname)
      : mAudio(*this), mVideo(*this), mFilename(std::move(fname))
    { }